

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

string * google::MakeCheckOpString<void_const*,void*>(void **v1,void **v2,char *exprtext)

{
  ostream *poVar1;
  string *psVar2;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_20;
  
  base::CheckOpMessageBuilder::CheckOpMessageBuilder(&local_20,exprtext);
  std::ostream::_M_insert<void_const*>(local_20.stream_);
  poVar1 = base::CheckOpMessageBuilder::ForVar2(&local_20);
  std::ostream::_M_insert<void_const*>(poVar1);
  psVar2 = base::CheckOpMessageBuilder::NewString_abi_cxx11_(&local_20);
  base::CheckOpMessageBuilder::~CheckOpMessageBuilder(&local_20);
  return psVar2;
}

Assistant:

std::string* MakeCheckOpString(const T1& v1, const T2& v2, const char* exprtext) {
  base::CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}